

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virgo.h
# Opt level: O2

ostream * virgo::operator<<(ostream *output,Chessboard *board)

{
  ostream *poVar1;
  char cVar2;
  int file;
  long lVar3;
  allocator local_65;
  uint local_64;
  ostream *local_60;
  long local_58;
  string grid;
  
  local_60 = output;
  std::__cxx11::string::string((string *)&grid,"      A   B   C   D   E   F   G   H  \n",&local_65);
  std::__cxx11::string::append((char *)&grid);
  lVar3 = 0;
  while (lVar3 != 8) {
    local_64 = (uint)(byte)(0x38 - (char)lVar3);
    cVar2 = (char)&grid;
    local_58 = lVar3;
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::append((char *)&grid);
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      std::__cxx11::string::push_back(cVar2);
      std::__cxx11::string::append((char *)&grid);
    }
    std::__cxx11::string::append((char *)&grid);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::append((char *)&grid);
    lVar3 = local_58 + 1;
  }
  std::__cxx11::string::append((char *)&grid);
  poVar1 = std::operator<<(local_60,(string *)&grid);
  std::__cxx11::string::~string((string *)&grid);
  return poVar1;
}

Assistant:

inline std::ostream & operator << (std::ostream & output, const Chessboard & board){
        static uint8_t pieceIcons[12] = {'p', 'r', 'n', 'b', 'k', 'q', 'P', 'R', 'N', 'B', 'K', 'Q'};

        std::string grid = "      A   B   C   D   E   F   G   H  \n";
        grid.append("    +---+---+---+---+---+---+---+---+ \n");

        for(int row = 0; row < 8; row++) {
            grid.push_back('8' - row);
            grid.append("   | ");
            for (int file = 0; file < 8; file++) {
                std::pair<Piece, Player> p = board[file + (7-row) * 8];
                if(p.first == EMPTY) grid.push_back(' ');
                else grid.push_back(pieceIcons[p.second * 6 + p.first]);
                grid.append(" | ");
            }
            grid.append("  ");
            grid.push_back('8' - row);
            grid.push_back('\n');
            grid.append("    +---+---+---+---+---+---+---+---+    \n");
        }

        grid.append("      A   B   C   D   E   F   G   H  \n");
        return output << grid;
    }